

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> * __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu
          (optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> *__return_storage_ptr__,
          dwarf_resolver *this,Dwarf_Addr pc)

{
  source_location location;
  source_location location_00;
  source_location location_01;
  int iVar1;
  cache_mode cVar2;
  Dwarf_Bool DVar3;
  anon_union_8_2_d41c7fdf_for_optional<const_cpptrace::detail::libdwarf::die_object_*,_0>_2 this_00;
  skeleton_info *this_01;
  skeleton_info *cu_die_00;
  skeleton_info *psVar4;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0> *this_02;
  undefined1 auStack_b8 [14];
  Dwarf_Half dwversion;
  Dwarf_Addr pc_local;
  Dwarf_Half offset_size;
  Dwarf_Error error;
  undefined8 uStack_90;
  bool local_88;
  anon_union_8_2_d41c7fdf_for_optional<const_cpptrace::detail::libdwarf::die_object_*,_0>_2 local_80
  ;
  bool local_78;
  Dwarf_Half local_70;
  Dwarf_Die raw_die;
  Dwarf_Off cu_die_offset;
  Dwarf_Arange arange;
  die_object cu_die;
  
  pc_local = pc;
  if ((this->aranges != (Dwarf_Arange *)0x0) && ((this->skeleton).holds_value == false)) {
    error = (Dwarf_Error)0x0;
    iVar1 = dwarf_get_arange(this->aranges,this->arange_count,pc,&arange,&error);
    if (iVar1 == 1) {
LAB_00195b3b:
      handle_dwarf_error(this->dbg,error);
    }
    if (iVar1 == 0) {
      error = (Dwarf_Error)0x0;
      iVar1 = dwarf_get_cu_die_offset(arange,&cu_die_offset,&error);
      if (iVar1 != 1) {
        location._14_2_ = dwversion;
        location._0_14_ = auStack_b8;
        assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x1e2e50,
                          "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,location);
        error = (Dwarf_Error)0x0;
        iVar1 = dwarf_offdie_b(this->dbg,cu_die_offset,1,&raw_die,&error);
        if (iVar1 != 1) {
          location_00._14_2_ = dwversion;
          location_00._0_14_ = auStack_b8;
          assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x1e2ee7,
                            "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,location_00);
          die_object::die_object(&cu_die,this->dbg,raw_die);
          offset_size = 0;
          dwversion = 0;
          iVar1 = dwarf_get_version_of_die(cu_die.die,&dwversion,&offset_size);
          location_01._14_2_ = dwversion;
          location_01._0_14_ = auStack_b8;
          assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x1e2f2d,
                            "optional<cu_info> cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(Dwarf_Addr)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,location_01);
          local_88 = true;
          error = (Dwarf_Error)cu_die.dbg;
          uStack_90 = cu_die.die;
          cu_die.dbg = (Dwarf_Debug)0x0;
          cu_die.die = (Dwarf_Die)0x0;
          local_78 = false;
          local_70 = dwversion;
          optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::
          optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>
                    (__return_storage_ptr__,(cu_info *)&error);
          maybe_owned_die_object::~maybe_owned_die_object((maybe_owned_die_object *)&error);
          die_object::~die_object(&cu_die);
          return __return_storage_ptr__;
        }
      }
      goto LAB_00195b3b;
    }
  }
  cVar2 = get_cache_mode();
  if (cVar2 == prioritize_memory) {
    __return_storage_ptr__->holds_value = false;
    cu_die.dbg = (Dwarf_Debug)this;
    cu_die.die = (Dwarf_Die)pc;
    std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
    function<cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(unsigned_long_long)::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
              ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&error,
               (anon_class_24_3_e602f920 *)&cu_die);
    walk_compilation_units
              (this,(function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> *)&error);
    std::_Function_base::~_Function_base((_Function_base *)&error);
    return __return_storage_ptr__;
  }
  lazy_generate_cu_cache(this);
  this_00 = (anon_union_8_2_d41c7fdf_for_optional<const_cpptrace::detail::libdwarf::die_object_*,_0>_2
             )first_less_than_or_equal<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::cu_entry*,std::vector<cpptrace::detail::libdwarf::cu_entry,std::allocator<cpptrace::detail::libdwarf::cu_entry>>>,unsigned_long_long,cpptrace::detail::libdwarf::dwarf_resolver::lookup_cu(unsigned_long_long)::_lambda(unsigned_long_long,cpptrace::detail::libdwarf::cu_entry_const&)_1_>
                        ((this->cu_cache).
                         super__Vector_base<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->cu_cache).
                         super__Vector_base<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&pc_local);
  if ((cu_entry *)this_00.uvalue ==
      (this->cu_cache).
      super__Vector_base<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001959d9:
    __return_storage_ptr__->holds_value = false;
  }
  else {
    if ((this->skeleton).holds_value == true) {
      this_02 = &this->skeleton;
      this_01 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(this_02);
      cu_die_00 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(this_02);
      psVar4 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(this_02);
      DVar3 = die_object::pc_in_die
                        (&this_01->cu_die,&cu_die_00->cu_die,(uint)psVar4->dwversion,pc_local);
      if (DVar3 == 0) goto LAB_00195951;
    }
    else {
LAB_00195951:
      DVar3 = die_object::pc_in_die
                        (this_00.uvalue,this_00.uvalue,(uint)*(ushort *)&this_00.uvalue[1].dbg,
                         pc_local);
      if (DVar3 == 0) goto LAB_001959d9;
    }
    local_88 = false;
    local_78 = true;
    local_70 = *(Dwarf_Half *)&this_00.uvalue[1].dbg;
    local_80 = this_00;
    optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::
    optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>
              (__return_storage_ptr__,(cu_info *)&error);
    maybe_owned_die_object::~maybe_owned_die_object((maybe_owned_die_object *)&error);
  }
  return __return_storage_ptr__;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        optional<cu_info> lookup_cu(Dwarf_Addr pc) {
            // Check for .debug_aranges for fast lookup
            if(aranges && !skeleton) { // don't bother under split dwarf
                // Try to find pc in aranges
                Dwarf_Arange arange;
                if(wrap(dwarf_get_arange, aranges, arange_count, pc, &arange) == DW_DLV_OK) {
                    // Address in table, load CU die
                    Dwarf_Off cu_die_offset;
                    VERIFY(wrap(dwarf_get_cu_die_offset, arange, &cu_die_offset) == DW_DLV_OK);
                    Dwarf_Die raw_die;
                    // Setting is_info = true for now, assuming in .debug_info rather than .debug_types
                    VERIFY(wrap(dwarf_offdie_b, dbg, cu_die_offset, true, &raw_die) == DW_DLV_OK);
                    die_object cu_die(dbg, raw_die);
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    VERIFY(dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size) == DW_DLV_OK);
                    if(trace_dwarf) {
                        std::fprintf(stderr, "Found CU in aranges\n");
                        cu_die.print();
                    }
                    return cu_info{maybe_owned_die_object::owned(std::move(cu_die)), dwversion};
                }
            }
            // otherwise, or if not in aranges
            // one reason to fallback here is if the compilation has dwarf generated from different compilers and only
            // some of them generate aranges (e.g. static linking with cpptrace after specifying clang++ as the c++
            // compiler while the C compiler defaults to an older gcc)
            if(get_cache_mode() == cache_mode::prioritize_memory) {
                // walk for the cu and go from there
                optional<cu_info> info;
                walk_compilation_units([this, pc, &info] (const die_object& cu_die) {
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                    //auto p = cu_die.get_pc_range(dwversion);
                    //cu_die.print();
                    //fprintf(stderr, "        %llx, %llx\n", p.first, p.second);
                    if(trace_dwarf) {
                        std::fprintf(stderr, "CU: %d %s\n", dwversion, cu_die.get_name().c_str());
                    }
                    // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                    if(
                        (
                            skeleton
                            && skeleton.unwrap().cu_die.pc_in_die(
                                skeleton.unwrap().cu_die,
                                skeleton.unwrap().dwversion,
                                pc
                            )
                        ) || cu_die.pc_in_die(cu_die, dwversion, pc)
                    ) {
                        if(trace_dwarf) {
                            std::fprintf(
                                stderr,
                                "pc in die %08llx %s (now searching for %08llx)\n",
                                to_ull(cu_die.get_global_offset()),
                                cu_die.get_tag_name(),
                                to_ull(pc)
                            );
                        }
                        info = cu_info{maybe_owned_die_object::owned(cu_die.clone()), dwversion};
                        return false;
                    }
                    return true;
                });
                return info;
            } else {
                lazy_generate_cu_cache();
                // look up the cu
                auto vec_it = first_less_than_or_equal(
                    cu_cache.begin(),
                    cu_cache.end(),
                    pc,
                    [] (Dwarf_Addr pc, const cu_entry& entry) {
                        return pc < entry.low;
                    }
                );
                // TODO: Vec-it is already range-based, this range check is redundant
                // If the vector has been empty this can happen
                if(vec_it != cu_cache.end()) {
                    // TODO: Cache the range list?
                    // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                    if(
                        (
                            skeleton
                            && skeleton.unwrap().cu_die.pc_in_die(
                                skeleton.unwrap().cu_die,
                                skeleton.unwrap().dwversion,
                                pc
                            )
                        ) || vec_it->die.pc_in_die(vec_it->die, vec_it->dwversion, pc)
                    ) {
                        return cu_info{maybe_owned_die_object::ref(vec_it->die), vec_it->dwversion};
                    }
                } else {
                    // I've had this happen for _start, where there is a cached CU for the object but _start is outside
                    // of the CU's PC range
                    // ASSERT(cu_cache.size() == 0, "Vec should be empty?");
                }
                return nullopt;
            }
        }